

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O2

int mtar_next(mtar_t *tar)

{
  int iVar1;
  size_t sVar2;
  mtar_header_t h;
  mtar_header_t local_f0;
  
  iVar1 = mtar_read_header(tar,&local_f0);
  if (iVar1 == 0) {
    sVar2 = tar->pos + (-(int)local_f0.size & 0x1ff) + local_f0.size + 0x200;
    iVar1 = (*tar->seek)(tar,sVar2);
    tar->pos = sVar2;
  }
  return iVar1;
}

Assistant:

int mtar_next(mtar_t *tar) {
  int err;
  size_t n;
  mtar_header_t h;
  /* Load header */
  err = mtar_read_header(tar, &h);
  if (err) {
    return err;
  }
  /* Seek to next record */
  n = mtar_round_up(h.size, 512) + sizeof(mtar_raw_header_t);
  return mtar_seek(tar, tar->pos + n);
}